

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O3

uint Ivy_Hash(Ivy_Obj_t *pObj,int TableSize)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  pIVar1 = pObj->pFanin0;
  uVar4 = 0;
  uVar3 = 0;
  if (pIVar1 != (Ivy_Obj_t *)0x0) {
    uVar3 = *(int *)((ulong)pIVar1 & 0xfffffffffffffffe) * 0x1f01;
  }
  pIVar2 = pObj->pFanin1;
  if (pIVar2 != (Ivy_Obj_t *)0x0) {
    uVar4 = *(int *)((ulong)pIVar2 & 0xfffffffffffffffe) * 0xb9b;
  }
  uVar7 = 0x6a3;
  if ((*(uint *)&pObj->field_0x8 & 0xf) != 6) {
    uVar7 = 0;
  }
  uVar5 = 0x38f;
  if (((ulong)pIVar1 & 1) == 0) {
    uVar5 = 0;
  }
  uVar6 = 0x161;
  if (((ulong)pIVar2 & 1) == 0) {
    uVar6 = 0;
  }
  return (uVar3 ^ uVar6 ^ uVar4 ^ uVar5 ^ uVar7 ^ (*(uint *)&pObj->field_0x8 >> 9 & 3) * 0x38f) %
         (uint)TableSize;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// hashing the node
static unsigned Ivy_Hash( Ivy_Obj_t * pObj, int TableSize ) 
{
    unsigned Key = Ivy_ObjIsExor(pObj) * 1699;
    Key ^= Ivy_ObjFaninId0(pObj) * 7937;
    Key ^= Ivy_ObjFaninId1(pObj) * 2971;
    Key ^= Ivy_ObjFaninC0(pObj) * 911;
    Key ^= Ivy_ObjFaninC1(pObj) * 353;
    Key ^= Ivy_ObjInit(pObj) * 911;
    return Key % TableSize;
}